

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# executor.hpp
# Opt level: O3

void __thiscall tf::Executor::_tear_down_topology(Executor *this,Worker *worker,Topology *tpg)

{
  size_t *psVar1;
  Taskflow *pTVar2;
  _Map_pointer ppsVar3;
  _Elt_pointer psVar4;
  Topology *pTVar5;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_00;
  iterator __position;
  Taskflow *pTVar6;
  bool bVar7;
  int iVar8;
  __normal_iterator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_*,_std::vector<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>_>
  _Var9;
  unique_lock<std::mutex> lock;
  unique_lock<std::mutex> local_40;
  
  pTVar2 = tpg->_taskflow;
  if (((tpg->_exception_ptr)._M_exception_object == (void *)0x0) &&
     (((uint)(tpg->_estate).super___atomic_base<int>._M_i >> 0x1d & 1) == 0)) {
    if ((tpg->_pred).super__Function_base._M_manager == (_Manager_type)0x0) {
      iVar8 = std::__throw_bad_function_call();
    }
    else {
      bVar7 = (*(tpg->_pred)._M_invoker)((_Any_data *)&tpg->_pred);
      if (bVar7) goto LAB_00149122;
      iVar8 = pthread_mutex_lock((pthread_mutex_t *)&pTVar2->_mutex);
      if (iVar8 == 0) {
        pTVar6 = tpg->_taskflow;
        _Var9 = _set_up_graph<__gnu_cxx::__normal_iterator<std::unique_ptr<tf::Node,std::default_delete<tf::Node>>*,std::vector<std::unique_ptr<tf::Node,std::default_delete<tf::Node>>,std::allocator<std::unique_ptr<tf::Node,std::default_delete<tf::Node>>>>>>
                          (this,(pTVar6->_graph).
                                super_vector<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
                                .
                                super__Vector_base<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
                                ._M_impl.super__Vector_impl_data._M_start,
                           (pTVar6->_graph).
                           super_vector<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
                           .
                           super__Vector_base<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_finish,tpg,(Node *)0x0);
        (tpg->_join_counter).super___atomic_base<unsigned_long>._M_i =
             (long)_Var9._M_current -
             (long)(pTVar6->_graph).
                   super_vector<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
                   .
                   super__Vector_base<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start >> 3;
        _schedule<__gnu_cxx::__normal_iterator<std::unique_ptr<tf::Node,std::default_delete<tf::Node>>*,std::vector<std::unique_ptr<tf::Node,std::default_delete<tf::Node>>,std::allocator<std::unique_ptr<tf::Node,std::default_delete<tf::Node>>>>>>
                  (this,worker,
                   (pTVar6->_graph).
                   super_vector<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
                   .
                   super__Vector_base<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start,_Var9);
        pthread_mutex_unlock((pthread_mutex_t *)&pTVar2->_mutex);
        return;
      }
    }
    std::__throw_system_error(iVar8);
  }
LAB_00149122:
  if ((tpg->_call).super__Function_base._M_manager != (_Manager_type)0x0) {
    (*(tpg->_call)._M_invoker)((_Any_data *)&tpg->_call);
  }
  local_40._M_device = &pTVar2->_mutex;
  local_40._M_owns = false;
  std::unique_lock<std::mutex>::lock(&local_40);
  local_40._M_owns = true;
  ppsVar3 = *(_Map_pointer *)
             ((long)&(pTVar2->_topologies).c.
                     super__Deque_base<std::shared_ptr<tf::Topology>,_std::allocator<std::shared_ptr<tf::Topology>_>_>
                     ._M_impl.super__Deque_impl_data._M_finish + 0x18);
  psVar4 = (pTVar2->_topologies).c.
           super__Deque_base<std::shared_ptr<tf::Topology>,_std::allocator<std::shared_ptr<tf::Topology>_>_>
           ._M_impl.super__Deque_impl_data._M_start._M_cur;
  if (((long)*(_Elt_pointer *)
              ((long)&(pTVar2->_topologies).c.
                      super__Deque_base<std::shared_ptr<tf::Topology>,_std::allocator<std::shared_ptr<tf::Topology>_>_>
                      ._M_impl.super__Deque_impl_data._M_start + 0x10) - (long)psVar4 >> 4) +
      ((long)(pTVar2->_topologies).c.
             super__Deque_base<std::shared_ptr<tf::Topology>,_std::allocator<std::shared_ptr<tf::Topology>_>_>
             ._M_impl.super__Deque_impl_data._M_finish._M_cur -
       (long)*(_Elt_pointer *)
              ((long)&(pTVar2->_topologies).c.
                      super__Deque_base<std::shared_ptr<tf::Topology>,_std::allocator<std::shared_ptr<tf::Topology>_>_>
                      ._M_impl.super__Deque_impl_data._M_finish + 8) >> 4) +
      ((((ulong)((long)ppsVar3 -
                (long)*(_Map_pointer *)
                       ((long)&(pTVar2->_topologies).c.
                               super__Deque_base<std::shared_ptr<tf::Topology>,_std::allocator<std::shared_ptr<tf::Topology>_>_>
                               ._M_impl.super__Deque_impl_data._M_start + 0x18)) >> 3) - 1) +
      (ulong)(ppsVar3 == (_Map_pointer)0x0)) * 0x20 < 2) {
    pTVar5 = (psVar4->super___shared_ptr<tf::Topology,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
    this_00 = (psVar4->super___shared_ptr<tf::Topology,_(__gnu_cxx::_Lock_policy)2>)._M_refcount.
              _M_pi;
    (psVar4->super___shared_ptr<tf::Topology,_(__gnu_cxx::_Lock_policy)2>)._M_ptr =
         (element_type *)0x0;
    (psVar4->super___shared_ptr<tf::Topology,_(__gnu_cxx::_Lock_policy)2>)._M_refcount._M_pi =
         (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    std::deque<std::shared_ptr<tf::Topology>,_std::allocator<std::shared_ptr<tf::Topology>_>_>::
    pop_front(&(pTVar2->_topologies).c);
    __position._M_node =
         (pTVar2->_satellite).super__Optional_base<std::_List_iterator<tf::Taskflow>,_true,_true>.
         _M_payload.super__Optional_payload_base<std::_List_iterator<tf::Taskflow>_>._M_payload.
         _M_value._M_node;
    bVar7 = (pTVar2->_satellite).super__Optional_base<std::_List_iterator<tf::Taskflow>,_true,_true>
            ._M_payload.super__Optional_payload_base<std::_List_iterator<tf::Taskflow>_>._M_engaged;
    std::unique_lock<std::mutex>::unlock(&local_40);
    Topology::_carry_out_promise(pTVar5);
    iVar8 = pthread_mutex_lock((pthread_mutex_t *)&this->_topology_mutex);
    if (iVar8 != 0) {
      std::__throw_system_error(iVar8);
    }
    psVar1 = &this->_num_topologies;
    *psVar1 = *psVar1 - 1;
    if (*psVar1 == 0) {
      std::condition_variable::notify_all();
    }
    pthread_mutex_unlock((pthread_mutex_t *)&this->_topology_mutex);
    if ((bVar7 & 1U) != 0) {
      iVar8 = pthread_mutex_lock((pthread_mutex_t *)this);
      if (iVar8 != 0) {
        std::__throw_system_error(iVar8);
      }
      std::__cxx11::list<tf::Taskflow,_std::allocator<tf::Taskflow>_>::_M_erase
                (&this->_taskflows,__position);
      pthread_mutex_unlock((pthread_mutex_t *)this);
    }
    if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00);
    }
  }
  else {
    std::promise<void>::set_value(&tpg->_promise);
    std::deque<std::shared_ptr<tf::Topology>,_std::allocator<std::shared_ptr<tf::Topology>_>_>::
    pop_front(&(pTVar2->_topologies).c);
    pTVar5 = (((pTVar2->_topologies).c.
               super__Deque_base<std::shared_ptr<tf::Topology>,_std::allocator<std::shared_ptr<tf::Topology>_>_>
               ._M_impl.super__Deque_impl_data._M_start._M_cur)->
             super___shared_ptr<tf::Topology,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
    iVar8 = pthread_mutex_lock((pthread_mutex_t *)&this->_topology_mutex);
    if (iVar8 != 0) {
      std::__throw_system_error(iVar8);
    }
    psVar1 = &this->_num_topologies;
    *psVar1 = *psVar1 - 1;
    if (*psVar1 == 0) {
      std::condition_variable::notify_all();
    }
    pthread_mutex_unlock((pthread_mutex_t *)&this->_topology_mutex);
    pTVar2 = pTVar5->_taskflow;
    _Var9 = _set_up_graph<__gnu_cxx::__normal_iterator<std::unique_ptr<tf::Node,std::default_delete<tf::Node>>*,std::vector<std::unique_ptr<tf::Node,std::default_delete<tf::Node>>,std::allocator<std::unique_ptr<tf::Node,std::default_delete<tf::Node>>>>>>
                      (this,(pTVar2->_graph).
                            super_vector<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
                            .
                            super__Vector_base<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_start,
                       (pTVar2->_graph).
                       super_vector<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
                       .
                       super__Vector_base<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_finish,pTVar5,(Node *)0x0);
    (pTVar5->_join_counter).super___atomic_base<unsigned_long>._M_i =
         (long)_Var9._M_current -
         (long)(pTVar2->_graph).
               super_vector<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
               .
               super__Vector_base<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start >> 3;
    _schedule<__gnu_cxx::__normal_iterator<std::unique_ptr<tf::Node,std::default_delete<tf::Node>>*,std::vector<std::unique_ptr<tf::Node,std::default_delete<tf::Node>>,std::allocator<std::unique_ptr<tf::Node,std::default_delete<tf::Node>>>>>>
              (this,worker,
               (pTVar2->_graph).
               super_vector<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
               .
               super__Vector_base<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start,_Var9);
  }
  std::unique_lock<std::mutex>::~unique_lock(&local_40);
  return;
}

Assistant:

inline void Executor::_tear_down_topology(Worker& worker, Topology* tpg) {

  auto &f = tpg->_taskflow;

  //assert(&tpg == &(f._topologies.front()));

  // case 1: we still need to run the topology again
  if(!tpg->_exception_ptr && !tpg->cancelled() && !tpg->_pred()) {
    //assert(tpg->_join_counter == 0);
    std::lock_guard<std::mutex> lock(f._mutex);
    _set_up_topology(&worker, tpg);
  }
  // case 2: the final run of this topology
  else {

    // invoke the callback after each run
    if(tpg->_call != nullptr) {
      tpg->_call();
    }

    // If there is another run (interleave between lock)
    if(std::unique_lock<std::mutex> lock(f._mutex); f._topologies.size()>1) {
      //assert(tpg->_join_counter == 0);

      // Set the promise
      tpg->_promise.set_value();
      f._topologies.pop();
      tpg = f._topologies.front().get();

      // decrement the topology
      _decrement_topology();

      // set up topology needs to be under the lock or it can
      // introduce memory order error with pop
      _set_up_topology(&worker, tpg);
    }
    else {
      //assert(f._topologies.size() == 1);

      auto fetched_tpg {std::move(f._topologies.front())};
      f._topologies.pop();
      auto satellite {f._satellite};

      lock.unlock();
      
      // Soon after we carry out the promise, there is no longer any guarantee
      // for the lifetime of the associated taskflow.
      fetched_tpg->_carry_out_promise();

      _decrement_topology();

      // remove the taskflow if it is managed by the executor
      // TODO: in the future, we may need to synchronize on wait
      // (which means the following code should the moved before set_value)
      if(satellite) {
        std::scoped_lock<std::mutex> satellite_lock(_taskflows_mutex);
        _taskflows.erase(*satellite);
      }
    }
  }
}